

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
DDSHeader::ToStringArray_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,DDSHeader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  char cVar4;
  long *plVar5;
  ulong uVar6;
  size_type *psVar7;
  uint uVar8;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar9;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  uint extraout_EDX_06;
  uint extraout_EDX_07;
  uint extraout_EDX_08;
  uint extraout_EDX_09;
  uint extraout_EDX_10;
  uint extraout_EDX_11;
  uint extraout_EDX_12;
  uint extraout_EDX_13;
  uint extraout_EDX_14;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  bool bVar13;
  string reserved;
  string __str_11;
  string __str_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  char *local_50;
  uint local_48;
  undefined4 uStack_44;
  char local_40 [16];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar9 = (this->impl_).pixel_format.size;
  cVar4 = '\x01';
  if (9 < uVar9) {
    uVar8 = uVar9;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar8 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0012f23b;
      }
      if (uVar8 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0012f23b;
      }
      if (uVar8 < 10000) goto LAB_0012f23b;
      bVar13 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar13);
    cVar4 = cVar4 + '\x01';
  }
LAB_0012f23b:
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_90,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_90._M_dataplus._M_p,(uint)local_90._M_string_length,uVar9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_90);
  uVar9 = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
    uVar9 = extraout_EDX_00;
  }
  DDSInfo::PrintPixelFormatFlagNames_abi_cxx11_
            (&local_90,(DDSInfo *)(ulong)(this->impl_).pixel_format.flags,uVar9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p._0_4_ = (this->impl_).pixel_format.fourcc;
  lVar10 = 0;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  do {
    std::__cxx11::string::append((char *)&local_90,(long)&local_70._M_dataplus._M_p + lVar10);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  uVar9 = (this->impl_).pixel_format.bit_count;
  cVar4 = '\x01';
  if (9 < uVar9) {
    uVar8 = uVar9;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar8 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0012f366;
      }
      if (uVar8 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0012f366;
      }
      if (uVar8 < 10000) goto LAB_0012f366;
      bVar13 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar13);
    cVar4 = cVar4 + '\x01';
  }
LAB_0012f366:
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_90,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_90._M_dataplus._M_p,(uint)local_90._M_string_length,uVar9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  bVar13 = (this->impl_).pixel_format.red_mask == 0;
  pcVar12 = "True";
  pcVar11 = "True";
  if (bVar13) {
    pcVar11 = "False";
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,pcVar11,pcVar11 + (ulong)bVar13 + 4);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  bVar13 = (this->impl_).pixel_format.blue_mask == 0;
  pcVar11 = "True";
  if (bVar13) {
    pcVar11 = "False";
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,pcVar11,pcVar11 + (ulong)bVar13 + 4);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  bVar13 = (this->impl_).pixel_format.green_mask == 0;
  pcVar11 = "True";
  if (bVar13) {
    pcVar11 = "False";
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,pcVar11,pcVar11 + (ulong)bVar13 + 4);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  bVar13 = (this->impl_).pixel_format.alpha_mask == 0;
  if (bVar13) {
    pcVar12 = "False";
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,pcVar12,pcVar12 + (ulong)bVar13 + 4);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  uVar9 = (this->impl_).size;
  cVar4 = '\x01';
  if (9 < uVar9) {
    uVar8 = uVar9;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar8 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0012f520;
      }
      if (uVar8 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0012f520;
      }
      if (uVar8 < 10000) goto LAB_0012f520;
      bVar13 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar13);
    cVar4 = cVar4 + '\x01';
  }
LAB_0012f520:
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_90,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_90._M_dataplus._M_p,(uint)local_90._M_string_length,uVar9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_90);
  uVar9 = extraout_EDX_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
    uVar9 = extraout_EDX_02;
  }
  DDSInfo::PrintDDSFlagNames_abi_cxx11_(&local_90,(DDSInfo *)(ulong)(this->impl_).flags,uVar9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  uVar9 = (this->impl_).width;
  cVar4 = '\x01';
  if (9 < uVar9) {
    uVar8 = uVar9;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar8 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0012f5e2;
      }
      if (uVar8 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0012f5e2;
      }
      if (uVar8 < 10000) goto LAB_0012f5e2;
      bVar13 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar13);
    cVar4 = cVar4 + '\x01';
  }
LAB_0012f5e2:
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_90,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_90._M_dataplus._M_p,(uint)local_90._M_string_length,uVar9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  uVar9 = (this->impl_).height;
  cVar4 = '\x01';
  if (9 < uVar9) {
    uVar8 = uVar9;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar8 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0012f676;
      }
      if (uVar8 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0012f676;
      }
      if (uVar8 < 10000) goto LAB_0012f676;
      bVar13 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar13);
    cVar4 = cVar4 + '\x01';
  }
LAB_0012f676:
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_90,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_90._M_dataplus._M_p,(uint)local_90._M_string_length,uVar9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  uVar9 = (this->impl_).depth;
  cVar4 = '\x01';
  if (9 < uVar9) {
    uVar8 = uVar9;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar8 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0012f70a;
      }
      if (uVar8 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0012f70a;
      }
      if (uVar8 < 10000) goto LAB_0012f70a;
      bVar13 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar13);
    cVar4 = cVar4 + '\x01';
  }
LAB_0012f70a:
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_90,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_90._M_dataplus._M_p,(uint)local_90._M_string_length,uVar9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  uVar9 = (this->impl_).mip_map_count;
  cVar4 = '\x01';
  if (9 < uVar9) {
    uVar8 = uVar9;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar8 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0012f79e;
      }
      if (uVar8 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0012f79e;
      }
      if (uVar8 < 10000) goto LAB_0012f79e;
      bVar13 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar13);
    cVar4 = cVar4 + '\x01';
  }
LAB_0012f79e:
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_90,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_90._M_dataplus._M_p,(uint)local_90._M_string_length,uVar9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  uVar9 = (this->impl_).pitch_or_linear_size;
  cVar4 = '\x01';
  if (9 < uVar9) {
    uVar8 = uVar9;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar8 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0012f832;
      }
      if (uVar8 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0012f832;
      }
      if (uVar8 < 10000) goto LAB_0012f832;
      bVar13 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar13);
    cVar4 = cVar4 + '\x01';
  }
LAB_0012f832:
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_90,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_90._M_dataplus._M_p,(uint)local_90._M_string_length,uVar9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_90);
  uVar9 = extraout_EDX_03;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
    uVar9 = extraout_EDX_04;
  }
  DDSInfo::PrintCaps1FlagNames_abi_cxx11_
            (&local_90,(DDSInfo *)(ulong)(this->impl_).capabilities1,uVar9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_90);
  uVar9 = extraout_EDX_05;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
    uVar9 = extraout_EDX_06;
  }
  DDSInfo::PrintCaps2FlagNames_abi_cxx11_
            (&local_90,(DDSInfo *)(ulong)(this->impl_).capabilities2,uVar9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  uVar9 = (this->impl_).capabilities3;
  cVar4 = '\x01';
  if (9 < uVar9) {
    uVar8 = uVar9;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar8 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0012f922;
      }
      if (uVar8 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0012f922;
      }
      if (uVar8 < 10000) goto LAB_0012f922;
      bVar13 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar13);
    cVar4 = cVar4 + '\x01';
  }
LAB_0012f922:
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_90,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_90._M_dataplus._M_p,(uint)local_90._M_string_length,uVar9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  uVar9 = (this->impl_).capabilities4;
  cVar4 = '\x01';
  if (9 < uVar9) {
    uVar8 = uVar9;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar8 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0012f9b6;
      }
      if (uVar8 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0012f9b6;
      }
      if (uVar8 < 10000) goto LAB_0012f9b6;
      bVar13 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar13);
    cVar4 = cVar4 + '\x01';
  }
LAB_0012f9b6:
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_90,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_90._M_dataplus._M_p,(uint)local_90._M_string_length,uVar9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  lVar10 = 0x24;
  paVar2 = &local_70.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  do {
    uVar9 = *(uint *)((long)(this->impl_).reserved + lVar10 + -0x24);
    cVar4 = '\x01';
    if (9 < uVar9) {
      uVar8 = uVar9;
      cVar3 = '\x04';
      do {
        cVar4 = cVar3;
        if (uVar8 < 100) {
          cVar4 = cVar4 + -2;
          goto LAB_0012fa78;
        }
        if (uVar8 < 1000) {
          cVar4 = cVar4 + -1;
          goto LAB_0012fa78;
        }
        if (uVar8 < 10000) goto LAB_0012fa78;
        bVar13 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        cVar3 = cVar4 + '\x04';
      } while (bVar13);
      cVar4 = cVar4 + '\x01';
    }
LAB_0012fa78:
    local_50 = local_40;
    std::__cxx11::string::_M_construct((ulong)&local_50,cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_50,local_48,uVar9);
    plVar5 = (long *)std::__cxx11::string::_M_replace_aux
                               ((ulong)&local_50,CONCAT44(uStack_44,local_48),0,'\x01');
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_70.field_2._M_allocated_capacity = *psVar7;
      local_70.field_2._8_8_ = plVar5[3];
      local_70._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar7;
      local_70._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_70._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x50);
  if (local_90._M_string_length != 0) {
    uVar6 = (ulong)((int)local_90._M_string_length - 1);
    if (local_90._M_dataplus._M_p[uVar6] == ':') {
      local_90._M_dataplus._M_p[uVar6] = '\0';
      local_90._M_string_length = uVar6;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_90);
  uVar9 = (this->impl_).reserved2;
  cVar4 = '\x01';
  if (9 < uVar9) {
    uVar8 = uVar9;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar8 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0012fbc8;
      }
      if (uVar8 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0012fbc8;
      }
      if (uVar8 < 10000) goto LAB_0012fbc8;
      bVar13 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar13);
    cVar4 = cVar4 + '\x01';
  }
LAB_0012fbc8:
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct((ulong)&local_70,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_70._M_dataplus._M_p,(uint)local_70._M_string_length,uVar9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_70);
  uVar9 = extraout_EDX_07;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
    uVar9 = extraout_EDX_08;
  }
  DDSInfo::PrintDXGIFormatFlagNames_abi_cxx11_
            (&local_70,(DDSInfo *)(ulong)(this->dx10_impl_).dxgi_format,uVar9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_70);
  uVar9 = extraout_EDX_09;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
    uVar9 = extraout_EDX_10;
  }
  DDSInfo::PrintResourceDimensionFlagNames_abi_cxx11_
            (&local_70,(DDSInfo *)(ulong)(this->dx10_impl_).resource_dimension,uVar9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  uVar9 = (this->dx10_impl_).array_size;
  cVar4 = '\x01';
  if (9 < uVar9) {
    uVar8 = uVar9;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar8 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0012fcc6;
      }
      if (uVar8 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0012fcc6;
      }
      if (uVar8 < 10000) goto LAB_0012fcc6;
      bVar13 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar13);
    cVar4 = cVar4 + '\x01';
  }
LAB_0012fcc6:
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct((ulong)&local_70,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_70._M_dataplus._M_p,(uint)local_70._M_string_length,uVar9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_70);
  uVar9 = extraout_EDX_11;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
    uVar9 = extraout_EDX_12;
  }
  DDSInfo::PrintTexMiscFlagNames_abi_cxx11_
            (&local_70,(DDSInfo *)(ulong)(this->dx10_impl_).misc_flags,uVar9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_70);
  uVar9 = extraout_EDX_13;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
    uVar9 = extraout_EDX_14;
  }
  DDSInfo::PrintTexMisc2FlagNames_abi_cxx11_
            (&local_70,(DDSInfo *)(ulong)(this->dx10_impl_).misc_flags_2,uVar9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> ToStringArray() {
    std::vector<std::string> output;
    const auto& impl(this->impl_);
    const auto& dx10_impl(this->dx10_impl_);
    output.push_back(std::to_string(impl.pixel_format.size));
    output.push_back(DDSInfo::PrintPixelFormatFlagNames(impl.pixel_format.flags));
    output.push_back(FourCCToString(impl.pixel_format.fourcc));
    output.push_back(std::to_string(impl.pixel_format.bit_count));
    output.push_back(impl.pixel_format.red_mask==0?"False":"True");
    output.push_back(impl.pixel_format.blue_mask==0?"False":"True");
    output.push_back(impl.pixel_format.green_mask==0?"False":"True");
    output.push_back(impl.pixel_format.alpha_mask==0?"False":"True");
    output.push_back(std::to_string(impl.size));
    output.push_back(DDSInfo::PrintDDSFlagNames(impl.flags));
    output.push_back(std::to_string(impl.width));
    output.push_back(std::to_string(impl.height));
    output.push_back(std::to_string(impl.depth));
    output.push_back(std::to_string(impl.mip_map_count));
    output.push_back(std::to_string(impl.pitch_or_linear_size));
    output.push_back(DDSInfo::PrintCaps1FlagNames(impl.capabilities1));
    output.push_back(DDSInfo::PrintCaps2FlagNames(impl.capabilities2));
    output.push_back(std::to_string(impl.capabilities3));
    output.push_back(std::to_string(impl.capabilities4));
    std::string reserved;
    for(auto& value: impl.reserved) {
      reserved.append(std::to_string(value) + ':');
    }
    RemoveTrailingCharacter(reserved,':');
    output.push_back(reserved);
    output.push_back(std::to_string(impl.reserved2));
    // DX 10
    output.push_back(DDSInfo::PrintDXGIFormatFlagNames(dx10_impl.dxgi_format));
    output.push_back(DDSInfo::PrintResourceDimensionFlagNames(dx10_impl.resource_dimension));
    output.push_back(std::to_string(dx10_impl.array_size));
    output.push_back(DDSInfo::PrintTexMiscFlagNames(dx10_impl.misc_flags));
    output.push_back(DDSInfo::PrintTexMisc2FlagNames(dx10_impl.misc_flags_2));
    return output;
    }